

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O0

uint __thiscall AmpIO::GetWriteNumBytes(AmpIO *this)

{
  uint32_t uVar1;
  int local_14;
  uint numQuads;
  AmpIO *this_local;
  
  uVar1 = BoardIO::GetFirmwareVersion((BoardIO *)this);
  if (uVar1 < 8) {
    local_14 = this->NumMotors + 1;
  }
  else {
    local_14 = this->NumMotors + 2;
  }
  return local_14 << 2;
}

Assistant:

unsigned int AmpIO::GetWriteNumBytes(void) const
{
    unsigned int numQuads;
    if (GetFirmwareVersion() < 8) {
        numQuads = NumMotors + 1;
    } else {
        numQuads = NumMotors + 2;
    }
    return numQuads * sizeof(quadlet_t);
}